

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::ShadeVertsLinearUV
               (ImDrawVert *vert_start,ImDrawVert *vert_end,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
               ImVec2 *uv_b,bool clamp)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar2 = b->x - a->x;
  fVar3 = b->y - a->y;
  fVar6 = uv_b->x;
  fVar7 = uv_b->y;
  fVar11 = uv_a->x;
  fVar8 = uv_a->y;
  fVar2 = (float)(-(uint)(fVar2 != 0.0) & (uint)((fVar6 - fVar11) / fVar2));
  fVar3 = (float)(-(uint)(fVar3 != 0.0) & (uint)((fVar7 - fVar8) / fVar3));
  if (clamp) {
    if (vert_start < vert_end) {
      fVar4 = fVar11;
      if (fVar6 <= fVar11) {
        fVar4 = fVar6;
      }
      fVar5 = fVar8;
      if (fVar7 <= fVar8) {
        fVar5 = fVar7;
      }
      fVar6 = (float)(~-(uint)(fVar6 <= fVar11) & (uint)fVar6 |
                     (uint)fVar11 & -(uint)(fVar6 <= fVar11));
      fVar7 = (float)(~-(uint)(fVar7 <= fVar8) & (uint)fVar7 | (uint)fVar8 & -(uint)(fVar7 <= fVar8)
                     );
      do {
        fVar8 = ((vert_start->pos).x - a->x) * fVar2 + uv_a->x;
        fVar10 = ((vert_start->pos).y - a->y) * fVar3 + uv_a->y;
        fVar11 = fVar7;
        if (fVar10 <= fVar7) {
          fVar11 = fVar10;
        }
        fVar12 = fVar6;
        if (fVar8 <= fVar6) {
          fVar12 = fVar8;
        }
        IVar9.x = (float)(-(uint)(fVar8 < fVar4) & (uint)fVar4 |
                         ~-(uint)(fVar8 < fVar4) & (uint)fVar12);
        IVar9.y = (float)(-(uint)(fVar10 < fVar5) & (uint)fVar5 |
                         ~-(uint)(fVar10 < fVar5) & (uint)fVar11);
        vert_start->uv = IVar9;
        vert_start = vert_start + 1;
      } while (vert_start < vert_end);
    }
  }
  else {
    for (; vert_start < vert_end; vert_start = vert_start + 1) {
      IVar1.y = ((vert_start->pos).y - a->y) * fVar3 + uv_a->y;
      IVar1.x = ((vert_start->pos).x - a->x) * fVar2 + uv_a->x;
      vert_start->uv = IVar1;
    }
  }
  return;
}

Assistant:

static inline ImVec2 operator-(const ImVec2& lhs, const ImVec2& rhs)            { return ImVec2(lhs.x-rhs.x, lhs.y-rhs.y); }